

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

void __thiscall Js::JavascriptLibrary::ResetIntlObject(JavascriptLibrary *this)

{
  Recycler *recycler;
  DynamicType *type;
  DynamicObject *ptr;
  
  recycler = this->recycler;
  type = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                          (RecyclableObject *)
                          (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                          (JavascriptMethod)0x0,
                          (DynamicTypeHandler *)
                          DeferredTypeHandler<&Js::JavascriptLibrary::InitializeIntlObject,Js::DefaultDeferredTypeFilter,false,(unsigned_short)0,(unsigned_short)0>
                          ::defaultInstance,false,false);
  ptr = DynamicObject::New(recycler,type);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(this->super_JavascriptLibraryBase).IntlObject,ptr);
  return;
}

Assistant:

void JavascriptLibrary::ResetIntlObject()
    {
        IntlObject = DynamicObject::New(
            recycler,
            DynamicType::New(scriptContext,
                             TypeIds_Object, objectPrototype, nullptr,
                             DeferredTypeHandler<InitializeIntlObject>::GetDefaultInstance()));
    }